

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::InvarianceTest::iterate(InvarianceTest *this)

{
  code *pcVar1;
  Vec4 *pVVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  RenderTarget *this_00;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  float *pfVar12;
  float *local_ce8;
  ShaderProgram *local_cb8;
  float *local_c30;
  ShaderProgram *local_c00;
  MessageBuilder local_be0;
  PixelBufferAccess local_a60;
  int local_a34;
  MessageBuilder local_a30;
  char *local_8b0;
  char *colorStr_1;
  char *depthFuncStr;
  undefined1 local_898 [4];
  GLenum depthFunc;
  Vec4 color_1;
  Vec4 green_1;
  Vec4 red_1;
  GLint colorLoc_1;
  GLint positionLoc_1;
  ShaderProgram *shader_1;
  undefined1 local_850 [4];
  int passNdx_1;
  MessageBuilder local_6d0;
  MessageBuilder local_550;
  PixelBufferAccess local_3d0;
  int local_3a4;
  MessageBuilder local_3a0;
  char *local_220;
  char *colorStr;
  Vec4 color;
  Vec4 green;
  Vec4 red;
  GLint colorLoc;
  GLint positionLoc;
  ShaderProgram *shader;
  undefined1 local_1d0 [4];
  int passNdx;
  byte local_39;
  undefined1 local_38 [7];
  bool error;
  Surface resultSurface;
  bool depthBufferExists;
  Functions *gl;
  InvarianceTest *this_local;
  long lVar9;
  
  pRVar8 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  this_00 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getDepthBits(this_00);
  resultSurface.m_pixels.m_cap._7_1_ = iVar4 != 0;
  tcu::Surface::Surface((Surface *)local_38,this->m_renderSize,this->m_renderSize);
  local_39 = 0;
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  (**(code **)(lVar9 + 0x1a00))(0,0,this->m_renderSize);
  (**(code **)(lVar9 + 0x40))(0x8892,this->m_arrayBuf);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderInvarianceTests.cpp"
                  ,0x10c);
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_1d0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d0,(char (*) [29])"Testing position invariance.");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1d0);
  for (shader._4_4_ = 0; shader._4_4_ < 2; shader._4_4_ = shader._4_4_ + 1) {
    if (shader._4_4_ == 0) {
      local_c00 = this->m_shader0;
    }
    else {
      local_c00 = this->m_shader1;
    }
    pcVar1 = *(code **)(lVar9 + 0x780);
    dVar5 = glu::ShaderProgram::getProgram(local_c00);
    uVar6 = (*pcVar1)(dVar5,"a_input");
    pcVar1 = *(code **)(lVar9 + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram(local_c00);
    uVar7 = (*pcVar1)(dVar5,"u_color");
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(color.m_data + 2),0.0,1.0,0.0,1.0);
    if (shader._4_4_ == 0) {
      pVVar2 = &green;
    }
    else {
      pVVar2 = &color;
    }
    local_c30 = pVVar2->m_data + 2;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&colorStr,(Vector<float,_4> *)local_c30);
    local_220 = "green";
    if (shader._4_4_ == 0) {
      local_220 = "red - purple";
    }
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3a0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_3a0,(char (*) [44])"Drawing position test pattern using shader ");
    local_3a4 = shader._4_4_ + 1;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3a4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Primitive color: ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_220);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3a0);
    pcVar1 = *(code **)(lVar9 + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram(local_c00);
    (*pcVar1)(dVar5);
    pcVar1 = *(code **)(lVar9 + 0x15a8);
    pfVar12 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)&colorStr);
    (*pcVar1)(uVar7,1,pfVar12);
    (**(code **)(lVar9 + 0x610))(uVar6);
    (**(code **)(lVar9 + 0x19f0))(uVar6,4,0x1406,0,0x10,0);
    (**(code **)(lVar9 + 0x538))(4,0,this->m_verticesInPattern);
    (**(code **)(lVar9 + 0x518))(uVar6);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"draw pass",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderInvarianceTests.cpp"
                    ,0x123);
  }
  pRVar8 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_3d0,(Surface *)local_38);
  glu::readPixels(pRVar8,0,0,&local_3d0);
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_550,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_550,
                       (char (*) [69])
                       "Verifying output. Expecting only green or background colored pixels.");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_550);
  bVar3 = checkImage(this,(Surface *)local_38);
  local_39 = (local_39 & 1) != 0 || ((bVar3 ^ 0xffU) & 1) != 0;
  if ((resultSurface.m_pixels.m_cap._7_1_ & 1) == 0) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_6d0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_6d0,(char (*) [45])"Depth buffer not available, skipping z-test.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6d0);
  }
  else {
    (**(code **)(lVar9 + 0x1d0))(0x3f800000);
    (**(code **)(lVar9 + 0x188))(0x4100);
    (**(code **)(lVar9 + 0x5e0))(0xb71);
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_850,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_850,
                         (char (*) [65])
                         "Testing position invariance with z-test. Enabling GL_DEPTH_TEST.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_850);
    for (shader_1._4_4_ = 0; shader_1._4_4_ < 2; shader_1._4_4_ = shader_1._4_4_ + 1) {
      if (shader_1._4_4_ == 0) {
        local_cb8 = this->m_shader0;
      }
      else {
        local_cb8 = this->m_shader1;
      }
      pcVar1 = *(code **)(lVar9 + 0x780);
      dVar5 = glu::ShaderProgram::getProgram(local_cb8);
      uVar6 = (*pcVar1)(dVar5,"a_input");
      pcVar1 = *(code **)(lVar9 + 0xb48);
      dVar5 = glu::ShaderProgram::getProgram(local_cb8);
      uVar7 = (*pcVar1)(dVar5,"u_color");
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green_1.m_data + 2),1.0,0.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(color_1.m_data + 2),0.0,1.0,0.0,1.0);
      if (shader_1._4_4_ == 0) {
        pVVar2 = &green_1;
      }
      else {
        pVVar2 = &color_1;
      }
      local_ce8 = pVVar2->m_data + 2;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_898,(Vector<float,_4> *)local_ce8);
      depthFuncStr._4_4_ = (uint)(shader_1._4_4_ == 0) * 5 + 0x202;
      colorStr_1 = "GL_EQUAL";
      if (shader_1._4_4_ == 0) {
        colorStr_1 = "GL_ALWAYS";
      }
      local_8b0 = "green";
      if (shader_1._4_4_ == 0) {
        local_8b0 = "red - purple";
      }
      pTVar10 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_a30,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_a30,(char (*) [37])"Drawing Z-test pattern using shader ");
      local_a34 = shader_1._4_4_ + 1;
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_a34);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])". Primitive color: ");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_8b0);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [14])". DepthFunc: ");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&colorStr_1);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a30);
      pcVar1 = *(code **)(lVar9 + 0x1680);
      dVar5 = glu::ShaderProgram::getProgram(local_cb8);
      (*pcVar1)(dVar5);
      pcVar1 = *(code **)(lVar9 + 0x15a8);
      pfVar12 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_898);
      (*pcVar1)(uVar7,1,pfVar12);
      (**(code **)(lVar9 + 0x4a0))(depthFuncStr._4_4_);
      (**(code **)(lVar9 + 0x610))(uVar6);
      (**(code **)(lVar9 + 0x19f0))(uVar6,4,0x1406,0,0x10,0);
      (**(code **)(lVar9 + 0x538))(4,this->m_verticesInPattern);
      (**(code **)(lVar9 + 0x518))(uVar6);
      dVar5 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar5,"draw pass",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderInvarianceTests.cpp"
                      ,0x150);
    }
    pRVar8 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess(&local_a60,(Surface *)local_38);
    glu::readPixels(pRVar8,0,0,&local_a60);
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_be0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_be0,
                         (char (*) [69])
                         "Verifying output. Expecting only green or background colored pixels.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_be0);
    bVar3 = checkImage(this,(Surface *)local_38);
    local_39 = (local_39 & 1) != 0 || ((bVar3 ^ 0xffU) & 1) != 0;
  }
  if ((local_39 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Detected variance between two invariant values");
  }
  tcu::Surface::~Surface((Surface *)local_38);
  return STOP;
}

Assistant:

InvarianceTest::IterateResult InvarianceTest::iterate (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				depthBufferExists	= m_context.getRenderTarget().getDepthBits() != 0;
	tcu::Surface			resultSurface		(m_renderSize, m_renderSize);
	bool					error				= false;

	// Prepare draw
	gl.clearColor		(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear			(GL_COLOR_BUFFER_BIT);
	gl.viewport			(0, 0, m_renderSize, m_renderSize);
	gl.bindBuffer		(GL_ARRAY_BUFFER, m_arrayBuf);
	GLU_EXPECT_NO_ERROR	(gl.getError(), "setup draw");

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance." << tcu::TestLog::EndMessage;

	// Draw position check passes
	for (int passNdx = 0; passNdx < 2; ++passNdx)
	{
		const glu::ShaderProgram&	shader		= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
		const glw::GLint			positionLoc = gl.getAttribLocation(shader.getProgram(), "a_input");
		const glw::GLint			colorLoc	= gl.getUniformLocation(shader.getProgram(), "u_color");
		const tcu::Vec4				red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		const tcu::Vec4				green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
		const tcu::Vec4				color		= (passNdx == 0) ? (red) : (green);
		const char* const			colorStr	= (passNdx == 0) ? ("red - purple") : ("green");

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing position test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << "." << tcu::TestLog::EndMessage;

		gl.useProgram				(shader.getProgram());
		gl.uniform4fv				(colorLoc, 1, color.getPtr());
		gl.enableVertexAttribArray	(positionLoc);
		gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
		gl.drawArrays				(GL_TRIANGLES, 0, m_verticesInPattern);
		gl.disableVertexAttribArray	(positionLoc);
		GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
	}

	// Read result
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	// Check there are no red pixels
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
	error |= !checkImage(resultSurface);

	if (!depthBufferExists)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Depth buffer not available, skipping z-test." << tcu::TestLog::EndMessage;
	}
	else
	{
		// Test with Z-test
		gl.clearDepthf		(1.0f);
		gl.clear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.enable			(GL_DEPTH_TEST);

		m_testCtx.getLog() << tcu::TestLog::Message << "Testing position invariance with z-test. Enabling GL_DEPTH_TEST." << tcu::TestLog::EndMessage;

		// Draw position check passes
		for (int passNdx = 0; passNdx < 2; ++passNdx)
		{
			const glu::ShaderProgram&	shader			= (passNdx == 0) ? (*m_shader0) : (*m_shader1);
			const glw::GLint			positionLoc		= gl.getAttribLocation(shader.getProgram(), "a_input");
			const glw::GLint			colorLoc		= gl.getUniformLocation(shader.getProgram(), "u_color");
			const tcu::Vec4				red				= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
			const tcu::Vec4				green			= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
			const tcu::Vec4				color			= (passNdx == 0) ? (red) : (green);
			const glw::GLenum			depthFunc		= (passNdx == 0) ? (GL_ALWAYS) : (GL_EQUAL);
			const char* const			depthFuncStr	= (passNdx == 0) ? ("GL_ALWAYS") : ("GL_EQUAL");
			const char* const			colorStr		= (passNdx == 0) ? ("red - purple") : ("green");

			m_testCtx.getLog() << tcu::TestLog::Message << "Drawing Z-test pattern using shader " << (passNdx+1) << ". Primitive color: " << colorStr << ". DepthFunc: " << depthFuncStr << tcu::TestLog::EndMessage;

			gl.useProgram				(shader.getProgram());
			gl.uniform4fv				(colorLoc, 1, color.getPtr());
			gl.depthFunc				(depthFunc);
			gl.enableVertexAttribArray	(positionLoc);
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), DE_NULL);
			gl.drawArrays				(GL_TRIANGLES, m_verticesInPattern, m_verticesInPattern); // !< buffer contains 2 m_verticesInPattern-sized patterns
			gl.disableVertexAttribArray	(positionLoc);
			GLU_EXPECT_NO_ERROR			(gl.getError(), "draw pass");
		}

		// Read result
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

		// Check there are no red pixels
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output. Expecting only green or background colored pixels." << tcu::TestLog::EndMessage;
		error |= !checkImage(resultSurface);
	}

	// Report result
	if (error)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Detected variance between two invariant values");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}